

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::HasGapAt(ON_PolyCurve *this,int segment_index)

{
  ON_Curve **ppOVar1;
  ON_Object *p;
  ON_Object *p_00;
  bool bVar2;
  ON_ArcCurve *pOVar3;
  ON_ArcCurve *pOVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ON_3dPoint P1;
  ON_3dPoint P0;
  
  if (segment_index < 0) {
    return false;
  }
  if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count + -1 <= segment_index) {
    return false;
  }
  ppOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
  p = (ON_Object *)ppOVar1[(uint)segment_index];
  p_00 = (ON_Object *)ppOVar1[(ulong)(uint)segment_index + 1];
  if (p_00 != (ON_Object *)0x0 && p != (ON_Object *)0x0) {
    ON_Curve::PointAtEnd(&P0,(ON_Curve *)p);
    ON_Curve::PointAtStart(&P1,(ON_Curve *)p_00);
    bVar2 = ON_PointsAreCoincident(3,false,&P0.x,&P1.x);
    if (!bVar2) {
      pOVar3 = ON_ArcCurve::Cast(p);
      pOVar4 = ON_ArcCurve::Cast(p_00);
      if (pOVar3 == (ON_ArcCurve *)0x0 && pOVar4 == (ON_ArcCurve *)0x0) {
        return true;
      }
      dVar7 = 0.0;
      if (pOVar3 != (ON_ArcCurve *)0x0) {
        dVar7 = (pOVar3->m_arc).super_ON_Circle.radius;
        dVar5 = ON_Arc::AngleRadians(&pOVar3->m_arc);
        dVar7 = dVar5 * dVar7 * 1e-10;
      }
      dVar5 = 0.0;
      if (pOVar4 != (ON_ArcCurve *)0x0) {
        dVar5 = (pOVar4->m_arc).super_ON_Circle.radius;
        dVar6 = ON_Arc::AngleRadians(&pOVar4->m_arc);
        dVar5 = dVar6 * dVar5 * 1e-10;
      }
      if (dVar7 <= 2.3283064365386963e-10) {
        dVar7 = 2.3283064365386963e-10;
      }
      if (dVar5 <= dVar7) {
        dVar5 = dVar7;
      }
      dVar7 = ON_3dPoint::DistanceTo(&P0,&P1);
      if (dVar5 < dVar7) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_PolyCurve::HasGapAt(int segment_index) const
{
  const int count = m_segment.Count();

  if ( segment_index < 0 || segment_index >= count-1 )
    return 0;

  const ON_Curve* c0 = m_segment[segment_index];
  const ON_Curve* c1 = m_segment[segment_index+1];
  if ( 0 == c0 || 0 == c1 )
    return false;

  ON_3dPoint P0 = c0->PointAtEnd();
  ON_3dPoint P1 = c1->PointAtStart();
  // Note:  The point compare test should be the same
  //        as the one used in ON_Curve::IsClosed().
  //
  // June 2019 - sometime in the past decade ON_PolyCurve::HasGap()
  // changed and the test here is different from ON_Curve::IsClosed().
  // The initial "Note" no longer applies because it's no longer
  // clear why the current ON_PolyCurve::HasGap() eliminated the "b c"
  // test that remained in ON_Curve::IsClosed().

  if ( false == ON_PointsAreCoincident( 3, false, &P0.x, &P1.x ) )
  {
    // To fix RR 13325 I allow a little more leeway for arcs.
    const ON_ArcCurve* arc0 = ON_ArcCurve::Cast(c0);
    const ON_ArcCurve* arc1 = ON_ArcCurve::Cast(c1);
    if ( 0 == arc0 && 0 == arc1 )
      return true; // gap

    double tol = ON_ZERO_TOLERANCE;
    const double tol0 = arc0  ? ( arc0->m_arc.radius*arc0->m_arc.AngleRadians()*1.0e-10 ) : 0.0;
    const double tol1 = arc1  ? ( arc1->m_arc.radius*arc1->m_arc.AngleRadians()*1.0e-10 ) : 0.0;
    if ( tol < tol0 ) 
      tol = tol0;
    if ( tol < tol1 ) 
      tol = tol1;
    const double d = P0.DistanceTo(P1);
    if ( d > tol )
    {
      return true; // gap
    }
  }

  return false; // no gap
}